

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Segment::PreloadCluster(Segment *this,Cluster *pCluster,ptrdiff_t idx)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  Cluster **ppCVar6;
  long lVar7;
  ulong uVar8;
  Cluster **ppCVar9;
  
  if (((pCluster != (Cluster *)0x0) && (pCluster->m_index < 0)) &&
     (lVar2 = this->m_clusterCount, lVar2 <= idx)) {
    lVar3 = this->m_clusterPreloadCount;
    uVar8 = this->m_clusterSize;
    lVar1 = lVar3 + lVar2;
    if (lVar1 <= (long)uVar8) {
      if (lVar1 < (long)uVar8) {
        ppCVar6 = this->m_clusters;
      }
      else {
        uVar5 = uVar8 * 2;
        bVar4 = 0 < (long)uVar8;
        uVar8 = 0x800;
        if (bVar4) {
          uVar8 = uVar5;
        }
        ppCVar6 = (Cluster **)
                  operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8,(nothrow_t *)&std::nothrow
                                );
        if (ppCVar6 == (Cluster **)0x0) {
          return false;
        }
        ppCVar9 = this->m_clusters;
        for (lVar7 = 0; lVar3 * 8 + lVar2 * 8 != lVar7; lVar7 = lVar7 + 8) {
          *(undefined8 *)((long)ppCVar6 + lVar7) = *(undefined8 *)((long)ppCVar9 + lVar7);
        }
        if (ppCVar9 != (Cluster **)0x0) {
          operator_delete__(ppCVar9);
        }
        this->m_clusters = ppCVar6;
        this->m_clusterSize = uVar8;
      }
      if ((ppCVar6 != (Cluster **)0x0) && (lVar1 < (long)uVar8 && idx <= lVar1)) {
        ppCVar9 = ppCVar6 + lVar1;
        while( true ) {
          if (ppCVar9 <= ppCVar6 + idx) {
            this->m_clusters[idx] = pCluster;
            this->m_clusterPreloadCount = this->m_clusterPreloadCount + 1;
            return true;
          }
          if (-1 < ppCVar9[-1]->m_index) break;
          *ppCVar9 = ppCVar9[-1];
          ppCVar9 = ppCVar9 + -1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Segment::PreloadCluster(Cluster* pCluster, ptrdiff_t idx) {
  if (pCluster == NULL || pCluster->m_index >= 0 || idx < m_clusterCount)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  if (size < count)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;
    Cluster** q = qq;

    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusters == NULL)
    return false;

  Cluster** const p = m_clusters + idx;

  Cluster** q = m_clusters + count;
  if (q < p || q >= (m_clusters + size))
    return false;

  while (q > p) {
    Cluster** const qq = q - 1;

    if ((*qq)->m_index >= 0)
      return false;

    *q = *qq;
    q = qq;
  }

  m_clusters[idx] = pCluster;
  ++m_clusterPreloadCount;
  return true;
}